

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<int&,std::integral_constant<unsigned_long,1ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (type *n,indexed_datum<int_&,_std::integral_constant<unsigned_long,_1UL>_> *self,
              variant<int_&> *param_3,variant<int_&> *param_4)

{
  variant<int_&> *pvVar1;
  variant<void,_void> *pvVar2;
  _t<std::remove_reference<variant_visitor<unique_visitor<variant<int_&>,_variant<int_&,_int_&>_>,_variant<void,_void>_>_&>_>
  *p_Var3;
  int local_58;
  indexed_element<int_&,_1UL> local_38;
  indexed_datum<int_&,_std::integral_constant<unsigned_long,_1UL>_> *local_30;
  type *self_local;
  size_t n_local;
  undefined1 local_18 [8];
  variant_visitor<ranges::detail::unique_visitor<ranges::variant<int_&>,_ranges::variant<int_&,_int_&>_>,_ranges::variant<void,_void>_>
  fun_local;
  
  local_30 = self;
  self_local = n;
  local_18 = (undefined1  [8])param_3;
  fun_local.fun_.var_ = param_4;
  if (n == (type *)0x0) {
    local_38 = invoke_fn::operator()
                         ((invoke_fn *)&invoke,(indexed_element_fn *)((long)&n_local + 7),self);
    invoke_fn::operator()
              ((invoke_fn *)&invoke,
               (variant_visitor<ranges::detail::unique_visitor<ranges::variant<int_&>,_ranges::variant<int_&,_int_&>_>,_ranges::variant<void,_void>_>
                *)local_18,&local_38);
    local_58 = 0;
  }
  else {
    p_Var3 = move<ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>,ranges::variant<void,void>>&>
                       ((variant_visitor<ranges::detail::unique_visitor<ranges::variant<int_&>,_ranges::variant<int_&,_int_&>_>,_ranges::variant<void,_void>_>
                         *)local_18);
    pvVar1 = (p_Var3->fun_).var_;
    pvVar2 = p_Var3->var_;
    move<ranges::detail::indexed_element_fn&>((indexed_element_fn *)((long)&n_local + 7));
    local_58 = variant_visit_<ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
                         ((undefined1 *)((long)&n[-1].field_0 + 7),pvVar1,pvVar2);
  }
  return local_58;
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }